

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O1

boolean lookup_id_mapping(uint gid,uint *nidp)

{
  ulong uVar1;
  ulong uVar2;
  bucket *pbVar3;
  ulong uVar4;
  
  if ((n_ids_mapped != 0) && (id_map != (bucket *)0x0)) {
    uVar4 = 0x40;
    pbVar3 = id_map;
    if (n_ids_mapped % 0x40 != 0) {
      uVar4 = (ulong)(uint)(n_ids_mapped % 0x40);
    }
    do {
      uVar1 = 0x40;
      if (pbVar3 == id_map) {
        uVar1 = uVar4;
      }
      while (uVar2 = uVar1, 0 < (int)uVar2) {
        uVar1 = uVar2 - 1;
        if (pbVar3->map[uVar2 - 1].gid == gid) {
          *nidp = pbVar3->map[uVar2 - 1].nid;
          return '\x01';
        }
      }
      pbVar3 = pbVar3->next;
    } while (pbVar3 != (bucket *)0x0);
  }
  return '\0';
}

Assistant:

boolean lookup_id_mapping(unsigned gid, unsigned *nidp)
{
    int i;
    struct bucket *curr;

    if (n_ids_mapped)
	for (curr = id_map; curr; curr = curr->next) {
	    /* first bucket might not be totally full */
	    if (curr == id_map) {
		i = n_ids_mapped % N_PER_BUCKET;
		if (i == 0) i = N_PER_BUCKET;
	    } else
		i = N_PER_BUCKET;

	    while (--i >= 0)
		if (gid == curr->map[i].gid) {
		    *nidp = curr->map[i].nid;
		    return TRUE;
		}
	}

    return FALSE;
}